

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_77::AsyncTee::SinkBase<unsigned_long>::SinkBase
          (SinkBase<unsigned_long> *this,PromiseFulfiller<unsigned_long> *fulfiller,
          Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *sinkLink)

{
  Fault f;
  Fault local_10;
  
  (this->super_Sink)._vptr_Sink = (_func_int **)&PTR___cxa_pure_virtual_0064f748;
  this->fulfiller = fulfiller;
  this->sinkLink = sinkLink;
  if (sinkLink->ptr == (Sink *)0x0) {
    sinkLink->ptr = &this->super_Sink;
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x550,FAILED,"sinkLink == nullptr","\"sink initiated with sink already in flight\"",
             (char (*) [43])"sink initiated with sink already in flight");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

explicit SinkBase(PromiseFulfiller<T>& fulfiller, Maybe<Sink&>& sinkLink)
        : fulfiller(fulfiller), sinkLink(sinkLink) {
      KJ_ASSERT(sinkLink == nullptr, "sink initiated with sink already in flight");
      sinkLink = *this;
    }